

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O2

void bench_ecmult_wnaf(void *arg,int iters)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  
  iVar6 = 0;
  iVar3 = 0;
  if (0 < iters) {
    iVar3 = iters;
  }
  iVar4 = 0;
  while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
    iVar1 = secp256k1_ecmult_wnaf((int *)((long)arg + 0x2d0),0x100,(secp256k1_scalar *)arg,5);
    iVar6 = iVar6 + iVar1;
    iVar1 = secp256k1_scalar_add
                      ((secp256k1_scalar *)arg,(secp256k1_scalar *)arg,
                       (secp256k1_scalar *)((long)arg + 0x20));
    iVar4 = iVar4 + iVar1;
  }
  if (iVar4 < 0) {
    pcVar5 = "test condition failed: overflow >= 0";
    uVar2 = 0x153;
  }
  else {
    if (iVar6 <= iters * 0x100) {
      return;
    }
    pcVar5 = "test condition failed: bits <= 256*iters";
    uVar2 = 0x154;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench_internal.c"
          ,uVar2,pcVar5);
  abort();
}

Assistant:

static void bench_ecmult_wnaf(void* arg, int iters) {
    int i, bits = 0, overflow = 0;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        bits += secp256k1_ecmult_wnaf(data->wnaf, 256, &data->scalar[0], WINDOW_A);
        overflow += secp256k1_scalar_add(&data->scalar[0], &data->scalar[0], &data->scalar[1]);
    }
    CHECK(overflow >= 0);
    CHECK(bits <= 256*iters);
}